

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie_tree.cpp
# Opt level: O3

bool __thiscall la::trie_tree::search(trie_tree *this,string *key)

{
  size_t sVar1;
  trie_node *ptVar2;
  ulong uVar3;
  
  ptVar2 = this->_root_node;
  if (key->_M_string_length == 0) {
    if (ptVar2 == (trie_node *)0x0) {
      return false;
    }
  }
  else {
    uVar3 = 0;
    do {
      sVar1 = trie_node::convertIndex((key->_M_dataplus)._M_p + uVar3);
      ptVar2 = (ptVar2->_children)._M_elems[sVar1];
      if (ptVar2 == (trie_node *)0x0) {
        return false;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < key->_M_string_length);
  }
  return ptVar2->_is_end_word;
}

Assistant:

bool trie_tree::search(const std::string &key)
    {
        auto cur_node{_root_node};
        for (decltype(key.size()) i{0}; i < key.size(); ++i)
        {
            const auto ci{trie_node::convertIndex(key[i])};
            if (cur_node->_children[ci] == nullptr)
                return false;
            cur_node = cur_node->_children[ci];
        }
        return (cur_node != nullptr && cur_node->_is_end_word);
    }